

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

int32_t icu_63::parseAsciiDigits(UnicodeString *str,int32_t start,int32_t length,UErrorCode *status)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int iVar4;
  int local_34;
  int32_t digit;
  int32_t i;
  int32_t num;
  int32_t sign;
  UErrorCode *status_local;
  int32_t length_local;
  int32_t start_local;
  UnicodeString *str_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (((length < 1) || (iVar3 = UnicodeString::length(str), iVar3 < start)) ||
       (iVar3 = UnicodeString::length(str), iVar3 < start + length)) {
      *status = U_INVALID_FORMAT_ERROR;
      str_local._4_4_ = 0;
    }
    else {
      i = 1;
      cVar2 = UnicodeString::charAt(str,start);
      if (cVar2 == L'+') {
        status_local._4_4_ = start + 1;
        status_local._0_4_ = length + -1;
      }
      else {
        cVar2 = UnicodeString::charAt(str,start);
        status_local._0_4_ = length;
        status_local._4_4_ = start;
        if (cVar2 == L'-') {
          i = -1;
          status_local._4_4_ = start + 1;
          status_local._0_4_ = length + -1;
        }
      }
      digit = 0;
      for (local_34 = 0; local_34 < (int32_t)status_local; local_34 = local_34 + 1) {
        cVar2 = UnicodeString::charAt(str,status_local._4_4_ + local_34);
        iVar4 = (ushort)cVar2 - 0x30;
        if ((iVar4 < 0) || (9 < iVar4)) {
          *status = U_INVALID_FORMAT_ERROR;
          return 0;
        }
        digit = digit * 10 + iVar4;
      }
      str_local._4_4_ = i * digit;
    }
  }
  else {
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

static int32_t parseAsciiDigits(const UnicodeString& str, int32_t start, int32_t length, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return 0;
    }
    if (length <= 0 || str.length() < start || (start + length) > str.length()) {
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
    int32_t sign = 1;
    if (str.charAt(start) == PLUS) {
        start++;
        length--;
    } else if (str.charAt(start) == MINUS) {
        sign = -1;
        start++;
        length--;
    }
    int32_t num = 0;
    for (int32_t i = 0; i < length; i++) {
        int32_t digit = str.charAt(start + i) - 0x0030;
        if (digit < 0 || digit > 9) {
            status = U_INVALID_FORMAT_ERROR;
            return 0;
        }
        num = 10 * num + digit;
    }
    return sign * num;    
}